

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Plane *_plane1,Plane *_plane2)

{
  vec<3,_float,_(glm::qualifier)0> local_28;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  __return_storage_ptr__->distance = 0.0;
  local_18._0_8_ = *(undefined8 *)_plane1;
  local_18.field_2 =
       *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(_plane1 + 8);
  local_28._0_8_ = *(undefined8 *)_plane2;
  local_28.field_2 =
       *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(_plane2 + 8);
  glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_18,&local_28);
  __return_storage_ptr__->hit = false;
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Plane& _plane1, const Plane& _plane2) {
    IntersectionData idata;
    
    glm::vec3 n1 = _plane1.getNormal();
    glm::vec3 n2 = _plane2.getNormal();
    float d1 = _plane1.getDCoeff();
    float d2 = _plane2.getDCoeff();
    
    // Check if planes are parallel, if so return false:
    glm::vec3 dir= glm::cross(_plane1.getNormal(),_plane2.getNormal());
    
    idata.hit = dir.length() < EPS;

    if (idata.hit) {
        // Direction of intersection is the cross product of the two normals:
        dir = glm::normalize(dir);
        
        // Thank you Toxi!
        float offDiagonal = glm::dot(n1,n2);
        float det = 1.0 / (1 - offDiagonal * offDiagonal);
        float a = (d1 - d2 * offDiagonal) * det;
        float b = (d2 - d1 * offDiagonal) * det;
        glm::vec3 anchor = glm::normalize(n1) * a + glm::normalize(n2) * b;
        
        idata.position = anchor;
        idata.direction = dir;
    }
    
    return idata;
}